

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O3

void substcap(luaL_Buffer *b,CapState *cs)

{
  byte bVar1;
  Capture *pCVar2;
  Capture *pCVar3;
  int iVar4;
  size_t l;
  char *s;
  char *pcVar5;
  
  pCVar2 = cs->cap;
  s = pCVar2->s;
  if (pCVar2->siz == 0) {
    pCVar3 = pCVar2 + 1;
    cs->cap = pCVar3;
    bVar1 = pCVar2[1].kind;
    while (bVar1 != '\0') {
      pcVar5 = pCVar3->s;
      luaL_addlstring(b,s,(long)pcVar5 - (long)s);
      iVar4 = addonestring(b,cs,"replacement");
      pCVar3 = cs->cap;
      if (iVar4 != 0) {
        pcVar5 = pCVar3[-1].s + ((ulong)pCVar3[-1].siz - 1);
      }
      s = pcVar5;
      bVar1 = pCVar3->kind;
    }
    l = (long)pCVar3->s - (long)s;
  }
  else {
    l = (size_t)(pCVar2->siz - 1);
  }
  luaL_addlstring(b,s,l);
  cs->cap = cs->cap + 1;
  return;
}

Assistant:

static void substcap (luaL_Buffer *b, CapState *cs) {
  const char *curr = cs->cap->s;
  if (isfullcap(cs->cap))  /* no nested captures? */
    luaL_addlstring(b, curr, cs->cap->siz - 1);  /* keep original text */
  else {
    cs->cap++;  /* skip open entry */
    while (!isclosecap(cs->cap)) {  /* traverse nested captures */
      const char *next = cs->cap->s;
      luaL_addlstring(b, curr, next - curr);  /* add text up to capture */
      if (addonestring(b, cs, "replacement"))
        curr = closeaddr(cs->cap - 1);  /* continue after match */
      else  /* no capture value */
        curr = next;  /* keep original text in final result */
    }
    luaL_addlstring(b, curr, cs->cap->s - curr);  /* add last piece of text */
  }
  cs->cap++;  /* go to next capture */
}